

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decodeframe.c
# Opt level: O0

void decode_mbmi_block(AV1Decoder *pbi,DecoderCodingBlock *dcb,int mi_row,int mi_col,aom_reader *r,
                      PARTITION_TYPE partition,BLOCK_SIZE bsize)

{
  uint mi_row_00;
  uint mi_col_00;
  int in_ECX;
  int in_EDX;
  AV1Decoder *in_RSI;
  long in_RDI;
  int in_R8D;
  PARTITION_TYPE in_R9B;
  byte in_stack_00000008;
  BLOCK_SIZE uv_subsize;
  MACROBLOCKD *xd;
  int y_mis;
  int x_mis;
  int bh;
  int bw;
  SequenceHeader *seq_params;
  AV1_COMMON *cm;
  uint bw_00;
  int in_stack_ffffffffffffff9c;
  undefined4 in_stack_ffffffffffffffa0;
  uint uVar1;
  undefined4 in_stack_ffffffffffffffac;
  MACROBLOCKD *xd_00;
  
  xd_00 = *(MACROBLOCKD **)(in_RDI + 0x9be8);
  mi_col_00 = (uint)"\x01\x01\x02\x02\x02\x04\x04\x04\b\b\b\x10\x10\x10  \x01\x04\x02\b\x04\x10"
                    [in_stack_00000008];
  mi_row_00 = (uint)"\x01\x02\x01\x02\x04\x02\x04\b\x04\b\x10\b\x10 \x10 \x04\x01\b\x02\x10\x04"
                    [in_stack_00000008];
  if (*(int *)(in_RDI + 0x3d78) - in_ECX <= (int)mi_col_00) {
    mi_col_00 = *(int *)(in_RDI + 0x3d78) - in_ECX;
  }
  bw_00 = mi_row_00;
  if (*(int *)(in_RDI + 0x3d74) - in_EDX <= (int)mi_row_00) {
    bw_00 = *(int *)(in_RDI + 0x3d74) - in_EDX;
  }
  uVar1 = bw_00;
  set_offsets((AV1_COMMON *)(in_RDI + 0x3b60),xd_00,BLOCK_4X4,mi_row_00,mi_col_00,bw_00,in_R8D,
              in_ECX,(int)in_RSI);
  (*(in_RSI->dcb).xd.mi)->partition = in_R9B;
  av1_read_mode_info(in_RSI,(DecoderCodingBlock *)CONCAT44(in_stack_ffffffffffffffac,mi_col_00),
                     (aom_reader *)CONCAT44(uVar1,in_stack_ffffffffffffffa0),
                     in_stack_ffffffffffffff9c,bw_00);
  if ((2 < in_stack_00000008) &&
     (((*(int *)&xd_00->plane[0].pre[1].buf != 0 ||
       (*(int *)((long)&xd_00->plane[0].pre[1].buf + 4) != 0)) &&
      (av1_ss_size_lookup[in_stack_00000008][*(int *)&xd_00->plane[0].pre[1].buf]
       [*(int *)((long)&xd_00->plane[0].pre[1].buf + 4)] == BLOCK_INVALID)))) {
    aom_internal_error((in_RSI->dcb).xd.error_info,AOM_CODEC_CORRUPT_FRAME,"Invalid block size.");
  }
  return;
}

Assistant:

static inline void decode_mbmi_block(AV1Decoder *const pbi,
                                     DecoderCodingBlock *dcb, int mi_row,
                                     int mi_col, aom_reader *r,
                                     PARTITION_TYPE partition,
                                     BLOCK_SIZE bsize) {
  AV1_COMMON *const cm = &pbi->common;
  const SequenceHeader *const seq_params = cm->seq_params;
  const int bw = mi_size_wide[bsize];
  const int bh = mi_size_high[bsize];
  const int x_mis = AOMMIN(bw, cm->mi_params.mi_cols - mi_col);
  const int y_mis = AOMMIN(bh, cm->mi_params.mi_rows - mi_row);
  MACROBLOCKD *const xd = &dcb->xd;

#if CONFIG_ACCOUNTING
  aom_accounting_set_context(&pbi->accounting, mi_col, mi_row);
#endif
  set_offsets(cm, xd, bsize, mi_row, mi_col, bw, bh, x_mis, y_mis);
  xd->mi[0]->partition = partition;
  av1_read_mode_info(pbi, dcb, r, x_mis, y_mis);
  if (bsize >= BLOCK_8X8 &&
      (seq_params->subsampling_x || seq_params->subsampling_y)) {
    const BLOCK_SIZE uv_subsize =
        av1_ss_size_lookup[bsize][seq_params->subsampling_x]
                          [seq_params->subsampling_y];
    if (uv_subsize == BLOCK_INVALID)
      aom_internal_error(xd->error_info, AOM_CODEC_CORRUPT_FRAME,
                         "Invalid block size.");
  }
}